

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O3

void __thiscall
MT32Emu::MidiEventQueue::MidiEventQueue
          (MidiEventQueue *this,Bit32u useRingBufferSize,Bit32u storageBufferSize)

{
  SysexDataStorage *pSVar1;
  MidiEvent *pMVar2;
  Bit32u i;
  uint uVar3;
  
  pSVar1 = SysexDataStorage::create(storageBufferSize);
  this->sysexDataStorage = pSVar1;
  pMVar2 = (MidiEvent *)operator_new__((ulong)useRingBufferSize << 4);
  this->ringBuffer = pMVar2;
  this->ringBufferMask = useRingBufferSize - 1;
  uVar3 = 0;
  do {
    pMVar2[uVar3].sysexData = (Bit8u *)0x0;
    uVar3 = uVar3 + 1;
  } while (uVar3 <= useRingBufferSize - 1);
  this->startPosition = 0;
  this->endPosition = 0;
  return;
}

Assistant:

MidiEventQueue::MidiEventQueue(Bit32u useRingBufferSize, Bit32u storageBufferSize) :
	sysexDataStorage(*SysexDataStorage::create(storageBufferSize)),
	ringBuffer(new MidiEvent[useRingBufferSize]), ringBufferMask(useRingBufferSize - 1)
{
	for (Bit32u i = 0; i <= ringBufferMask; i++) {
		ringBuffer[i].sysexData = NULL;
	}
	reset();
}